

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  ImDrawVert *pIVar3;
  unsigned_short *puVar4;
  int iVar5;
  int iVar6;
  
  pIVar1 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
  pIVar1->ElemCount = pIVar1->ElemCount + idx_count;
  iVar2 = (this->VtxBuffer).Size;
  iVar6 = vtx_count + iVar2;
  iVar5 = (this->VtxBuffer).Capacity;
  if (iVar5 < iVar6) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar5 * 0x14);
    pIVar3 = (this->VtxBuffer).Data;
    if (pIVar3 == (ImDrawVert *)0x0) {
      pIVar3 = (ImDrawVert *)0x0;
    }
    else {
      memcpy(__dest,pIVar3,(long)(this->VtxBuffer).Size * 0x14);
      pIVar3 = (this->VtxBuffer).Data;
    }
    ImGui::MemFree(pIVar3);
    (this->VtxBuffer).Data = __dest;
    (this->VtxBuffer).Capacity = iVar5;
  }
  else {
    __dest = (this->VtxBuffer).Data;
  }
  (this->VtxBuffer).Size = iVar6;
  this->_VtxWritePtr = __dest + iVar2;
  iVar2 = (this->IdxBuffer).Size;
  iVar6 = idx_count + iVar2;
  iVar5 = (this->IdxBuffer).Capacity;
  if (iVar5 < iVar6) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
    puVar4 = (this->IdxBuffer).Data;
    if (puVar4 == (unsigned_short *)0x0) {
      puVar4 = (unsigned_short *)0x0;
    }
    else {
      memcpy(__dest_00,puVar4,(long)(this->IdxBuffer).Size * 2);
      puVar4 = (this->IdxBuffer).Data;
    }
    ImGui::MemFree(puVar4);
    (this->IdxBuffer).Data = __dest_00;
    (this->IdxBuffer).Capacity = iVar5;
  }
  else {
    __dest_00 = (this->IdxBuffer).Data;
  }
  (this->IdxBuffer).Size = iVar6;
  this->_IdxWritePtr = __dest_00 + iVar2;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size-1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}